

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest16::deinit(FunctionalTest16 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_1c;
  uint n_id;
  Functions *gl;
  FunctionalTest16 *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    if (this->m_fs_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x470))(this->m_fs_ids[local_1c]);
      this->m_fs_ids[local_1c] = 0;
    }
    if (this->m_fs_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_fs_po_ids[local_1c]);
      this->m_fs_po_ids[local_1c] = 0;
    }
    if (this->m_gs_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x470))(this->m_gs_ids[local_1c]);
      this->m_gs_ids[local_1c] = 0;
    }
    if (this->m_gs_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_gs_po_ids[local_1c]);
      this->m_gs_po_ids[local_1c] = 0;
    }
    if (this->m_pipeline_object_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x450))(1,this->m_pipeline_object_ids + local_1c);
    }
    if (this->m_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_po_ids[local_1c]);
      this->m_po_ids[local_1c] = 0;
    }
    if (this->m_tc_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x470))(this->m_tc_ids[local_1c]);
      this->m_tc_ids[local_1c] = 0;
    }
    if (this->m_tc_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_tc_po_ids[local_1c]);
      this->m_tc_po_ids[local_1c] = 0;
    }
    if (this->m_te_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x470))(this->m_te_ids[local_1c]);
      this->m_te_ids[local_1c] = 0;
    }
    if (this->m_te_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_te_po_ids[local_1c]);
      this->m_te_po_ids[local_1c] = 0;
    }
    if (this->m_vs_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x470))(this->m_vs_ids[local_1c]);
      this->m_vs_ids[local_1c] = 0;
    }
    if (this->m_vs_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_vs_po_ids[local_1c]);
      this->m_vs_po_ids[local_1c] = 0;
    }
  }
  return;
}

Assistant:

void FunctionalTest16::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_id = 0; n_id < 2; ++n_id)
	{
		if (m_fs_ids[n_id] != 0)
		{
			gl.deleteShader(m_fs_ids[n_id]);

			m_fs_ids[n_id] = 0;
		}

		if (m_fs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_fs_po_ids[n_id]);

			m_fs_po_ids[n_id] = 0;
		}

		if (m_gs_ids[n_id] != 0)
		{
			gl.deleteShader(m_gs_ids[n_id]);

			m_gs_ids[n_id] = 0;
		}

		if (m_gs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_gs_po_ids[n_id]);

			m_gs_po_ids[n_id] = 0;
		}

		if (m_pipeline_object_ids[n_id] != 0)
		{
			gl.deleteProgramPipelines(1 /* n */, m_pipeline_object_ids + n_id);
		}

		if (m_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_po_ids[n_id]);

			m_po_ids[n_id] = 0;
		}

		if (m_tc_ids[n_id] != 0)
		{
			gl.deleteShader(m_tc_ids[n_id]);

			m_tc_ids[n_id] = 0;
		}

		if (m_tc_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_tc_po_ids[n_id]);

			m_tc_po_ids[n_id] = 0;
		}

		if (m_te_ids[n_id] != 0)
		{
			gl.deleteShader(m_te_ids[n_id]);

			m_te_ids[n_id] = 0;
		}

		if (m_te_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_te_po_ids[n_id]);

			m_te_po_ids[n_id] = 0;
		}

		if (m_vs_ids[n_id] != 0)
		{
			gl.deleteShader(m_vs_ids[n_id]);

			m_vs_ids[n_id] = 0;
		}

		if (m_vs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_vs_po_ids[n_id]);

			m_vs_po_ids[n_id] = 0;
		}
	} /* for (both IDs) */
}